

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

bool embree::avx::
     BVHNIntersector1<8,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMIntersector1Moeller<4,_true>_>_>
     ::pointQuery(Intersectors *This,PointQuery *query,PointQueryContext *context)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  Geometry *this;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  byte bVar24;
  bool bVar25;
  bool bVar26;
  int iVar27;
  ulong *puVar28;
  long lVar29;
  byte bVar30;
  undefined1 (*pauVar31) [16];
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  undefined1 (*pauVar34) [16];
  undefined1 (*pauVar35) [16];
  long lVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  byte bVar40;
  undefined4 uVar41;
  ulong unaff_R15;
  size_t mask;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar52 [16];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar58 [16];
  undefined1 auVar63 [32];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [16];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar76 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [16];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar82 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [64];
  undefined1 auVar105 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2520 [8];
  float fStack_2518;
  float fStack_2514;
  float fStack_2510;
  float fStack_250c;
  float fStack_2508;
  float fStack_2504;
  float local_2500;
  float fStack_24fc;
  float fStack_24f8;
  float fStack_24f4;
  float fStack_24f0;
  float fStack_24ec;
  float fStack_24e8;
  float fStack_24e4;
  float local_24e0;
  float fStack_24dc;
  float fStack_24d8;
  float fStack_24d4;
  float fStack_24d0;
  float fStack_24cc;
  float fStack_24c8;
  float fStack_24c4;
  float local_24c0;
  float fStack_24bc;
  float fStack_24b8;
  float fStack_24b4;
  float fStack_24b0;
  float fStack_24ac;
  float fStack_24a8;
  float fStack_24a4;
  undefined1 local_2490 [16];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  float local_2440;
  float fStack_243c;
  float fStack_2438;
  float fStack_2434;
  float fStack_2430;
  float fStack_242c;
  float fStack_2428;
  float fStack_2424;
  undefined1 local_2420 [32];
  float local_2400;
  float fStack_23fc;
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  undefined1 local_23e0 [32];
  float local_23c0;
  float fStack_23bc;
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  float fStack_23a4;
  undefined1 local_23a0 [8];
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 == 8) {
    return false;
  }
  local_23a0 = (undefined1  [8])*(undefined8 *)&This->ptr[1].bounds.bounds0.lower.field_0;
  uStack_2398 = 0;
  if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
    auVar104 = ZEXT464((uint)(query->radius * query->radius));
  }
  else {
    aVar1 = (context->query_radius).field_0;
    auVar105 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
    auVar104 = ZEXT1664(auVar105);
  }
  pauVar35 = (undefined1 (*) [16])local_2390;
  local_24c0 = *(float *)&(query->p).field_0;
  fStack_24bc = local_24c0;
  fStack_24b8 = local_24c0;
  fStack_24b4 = local_24c0;
  fStack_24b0 = local_24c0;
  fStack_24ac = local_24c0;
  fStack_24a8 = local_24c0;
  fStack_24a4 = local_24c0;
  local_24e0 = *(float *)((long)&(query->p).field_0 + 4);
  fStack_24dc = local_24e0;
  fStack_24d8 = local_24e0;
  fStack_24d4 = local_24e0;
  fStack_24d0 = local_24e0;
  fStack_24cc = local_24e0;
  fStack_24c8 = local_24e0;
  fStack_24c4 = local_24e0;
  local_2500 = *(float *)((long)&(query->p).field_0 + 8);
  fStack_24fc = local_2500;
  fStack_24f8 = local_2500;
  fStack_24f4 = local_2500;
  fStack_24f0 = local_2500;
  fStack_24ec = local_2500;
  fStack_24e8 = local_2500;
  fStack_24e4 = local_2500;
  uVar41 = *(undefined4 *)&(context->query_radius).field_0;
  auVar48._4_4_ = uVar41;
  auVar48._0_4_ = uVar41;
  auVar48._8_4_ = uVar41;
  auVar48._12_4_ = uVar41;
  auVar48._16_4_ = uVar41;
  auVar48._20_4_ = uVar41;
  auVar48._24_4_ = uVar41;
  auVar48._28_4_ = uVar41;
  uVar41 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
  auVar60._4_4_ = uVar41;
  auVar60._0_4_ = uVar41;
  auVar60._8_4_ = uVar41;
  auVar60._12_4_ = uVar41;
  auVar60._16_4_ = uVar41;
  auVar60._20_4_ = uVar41;
  auVar60._24_4_ = uVar41;
  auVar60._28_4_ = uVar41;
  uVar41 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
  auVar54._4_4_ = uVar41;
  auVar54._0_4_ = uVar41;
  auVar54._8_4_ = uVar41;
  auVar54._12_4_ = uVar41;
  auVar54._16_4_ = uVar41;
  auVar54._20_4_ = uVar41;
  auVar54._24_4_ = uVar41;
  auVar54._28_4_ = uVar41;
  bVar26 = false;
  auVar105 = vpcmpeqd_avx(in_ZMM13._0_16_,in_ZMM13._0_16_);
  auVar106 = ZEXT1664(auVar105);
  auVar107 = ZEXT3264(CONCAT428(0xbf800000,
                                CONCAT424(0xbf800000,
                                          CONCAT420(0xbf800000,
                                                    CONCAT416(0xbf800000,
                                                              CONCAT412(0xbf800000,
                                                                        CONCAT48(0xbf800000,
                                                                                 0xbf800000bf800000)
                                                                       ))))));
  do {
    auVar18._4_4_ = fStack_24bc;
    auVar18._0_4_ = local_24c0;
    auVar18._8_4_ = fStack_24b8;
    auVar18._12_4_ = fStack_24b4;
    auVar18._16_4_ = fStack_24b0;
    auVar18._20_4_ = fStack_24ac;
    auVar18._24_4_ = fStack_24a8;
    auVar18._28_4_ = fStack_24a4;
    local_23e0 = vsubps_avx(auVar18,auVar48);
    fVar5 = auVar48._0_4_;
    fVar6 = auVar48._4_4_;
    fVar7 = auVar48._8_4_;
    fVar8 = auVar48._12_4_;
    fVar9 = auVar48._16_4_;
    fVar10 = auVar48._20_4_;
    fVar11 = auVar48._24_4_;
    local_2400 = local_24c0 + fVar5;
    fStack_23fc = fStack_24bc + fVar6;
    fStack_23f8 = fStack_24b8 + fVar7;
    fStack_23f4 = fStack_24b4 + fVar8;
    fStack_23f0 = fStack_24b0 + fVar9;
    fStack_23ec = fStack_24ac + fVar10;
    fStack_23e8 = fStack_24a8 + fVar11;
    fStack_23e4 = fStack_24a4 + auVar48._28_4_;
    auVar15._4_4_ = fStack_24dc;
    auVar15._0_4_ = local_24e0;
    auVar15._8_4_ = fStack_24d8;
    auVar15._12_4_ = fStack_24d4;
    auVar15._16_4_ = fStack_24d0;
    auVar15._20_4_ = fStack_24cc;
    auVar15._24_4_ = fStack_24c8;
    auVar15._28_4_ = fStack_24c4;
    local_2420 = vsubps_avx(auVar15,auVar60);
    local_2440 = local_24e0 + auVar60._0_4_;
    fStack_243c = fStack_24dc + auVar60._4_4_;
    fStack_2438 = fStack_24d8 + auVar60._8_4_;
    fStack_2434 = fStack_24d4 + auVar60._12_4_;
    fStack_2430 = fStack_24d0 + auVar60._16_4_;
    fStack_242c = fStack_24cc + auVar60._20_4_;
    fStack_2428 = fStack_24c8 + auVar60._24_4_;
    fStack_2424 = fStack_24c4 + auVar60._28_4_;
    auVar12._4_4_ = fStack_24fc;
    auVar12._0_4_ = local_2500;
    auVar12._8_4_ = fStack_24f8;
    auVar12._12_4_ = fStack_24f4;
    auVar12._16_4_ = fStack_24f0;
    auVar12._20_4_ = fStack_24ec;
    auVar12._24_4_ = fStack_24e8;
    auVar12._28_4_ = fStack_24e4;
    local_2460 = vsubps_avx(auVar12,auVar54);
    local_2480._0_4_ = local_2500 + auVar54._0_4_;
    local_2480._4_4_ = fStack_24fc + auVar54._4_4_;
    local_2480._8_4_ = fStack_24f8 + auVar54._8_4_;
    local_2480._12_4_ = fStack_24f4 + auVar54._12_4_;
    local_2480._16_4_ = fStack_24f0 + auVar54._16_4_;
    local_2480._20_4_ = fStack_24ec + auVar54._20_4_;
    local_2480._24_4_ = fStack_24e8 + auVar54._24_4_;
    local_2480._28_4_ = fStack_24e4 + auVar54._28_4_;
    local_23c0 = fVar5 * fVar5;
    fStack_23bc = fVar6 * fVar6;
    fStack_23b8 = fVar7 * fVar7;
    fStack_23b4 = fVar8 * fVar8;
    fStack_23b0 = fVar9 * fVar9;
    fStack_23ac = fVar10 * fVar10;
    fStack_23a8 = fVar11 * fVar11;
    fStack_23a4 = auVar48._28_4_;
    local_2490 = auVar104._0_16_;
    do {
      do {
        do {
          if (pauVar35 == (undefined1 (*) [16])local_23a0) {
            return bVar26;
          }
          pauVar34 = pauVar35 + -1;
          pauVar35 = pauVar35 + -1;
        } while (auVar104._0_4_ < *(float *)(*pauVar34 + 8));
        uVar38 = *(ulong *)*pauVar35;
        pauVar34 = pauVar35;
        do {
          auVar105 = auVar106._0_16_;
          if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
            if ((uVar38 & 8) == 0) {
              puVar28 = (ulong *)((uVar38 & 0xfffffffffffffff0) + 0x40);
              if ((uVar38 & 0xfffffffffffffff0) == 0) {
                puVar28 = (ulong *)0x0;
              }
              fVar5 = *(float *)(puVar28 + 6);
              fVar6 = *(float *)((long)puVar28 + 0x3c);
              auVar51._8_8_ = 0;
              auVar51._0_8_ = *puVar28;
              auVar75 = vpmovzxbd_avx(auVar51);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)((long)puVar28 + 4);
              auVar45 = vpmovzxbd_avx(auVar42);
              auVar61._16_16_ = auVar45;
              auVar61._0_16_ = auVar75;
              auVar48 = vcvtdq2ps_avx(auVar61);
              auVar62._0_4_ = fVar5 + fVar6 * auVar48._0_4_;
              auVar62._4_4_ = fVar5 + fVar6 * auVar48._4_4_;
              auVar62._8_4_ = fVar5 + fVar6 * auVar48._8_4_;
              auVar62._12_4_ = fVar5 + fVar6 * auVar48._12_4_;
              auVar62._16_4_ = fVar5 + fVar6 * auVar48._16_4_;
              auVar62._20_4_ = fVar5 + fVar6 * auVar48._20_4_;
              auVar62._24_4_ = fVar5 + fVar6 * auVar48._24_4_;
              auVar62._28_4_ = fVar5 + auVar48._28_4_;
              auVar67._8_8_ = 0;
              auVar67._0_8_ = puVar28[1];
              auVar75 = vpmovzxbd_avx(auVar67);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = *(ulong *)((long)puVar28 + 0xc);
              auVar45 = vpmovzxbd_avx(auVar64);
              auVar83._16_16_ = auVar45;
              auVar83._0_16_ = auVar75;
              auVar48 = vcvtdq2ps_avx(auVar83);
              fVar7 = *(float *)((long)puVar28 + 0x34);
              fVar8 = *(float *)(puVar28 + 8);
              auVar73._0_4_ = fVar5 + fVar6 * auVar48._0_4_;
              auVar73._4_4_ = fVar5 + fVar6 * auVar48._4_4_;
              auVar73._8_4_ = fVar5 + fVar6 * auVar48._8_4_;
              auVar73._12_4_ = fVar5 + fVar6 * auVar48._12_4_;
              auVar73._16_4_ = fVar5 + fVar6 * auVar48._16_4_;
              auVar73._20_4_ = fVar5 + fVar6 * auVar48._20_4_;
              auVar73._24_4_ = fVar5 + fVar6 * auVar48._24_4_;
              auVar73._28_4_ = fVar5 + fVar6;
              auVar75._8_8_ = 0;
              auVar75._0_8_ = puVar28[2];
              auVar75 = vpmovzxbd_avx(auVar75);
              auVar89._8_8_ = 0;
              auVar89._0_8_ = *(ulong *)((long)puVar28 + 0x14);
              auVar45 = vpmovzxbd_avx(auVar89);
              auVar77._16_16_ = auVar45;
              auVar77._0_16_ = auVar75;
              auVar48 = vcvtdq2ps_avx(auVar77);
              auVar78._0_4_ = fVar7 + fVar8 * auVar48._0_4_;
              auVar78._4_4_ = fVar7 + fVar8 * auVar48._4_4_;
              auVar78._8_4_ = fVar7 + fVar8 * auVar48._8_4_;
              auVar78._12_4_ = fVar7 + fVar8 * auVar48._12_4_;
              auVar78._16_4_ = fVar7 + fVar8 * auVar48._16_4_;
              auVar78._20_4_ = fVar7 + fVar8 * auVar48._20_4_;
              auVar78._24_4_ = fVar7 + fVar8 * auVar48._24_4_;
              auVar78._28_4_ = fVar7 + auVar48._28_4_;
              auVar90._8_8_ = 0;
              auVar90._0_8_ = puVar28[3];
              auVar75 = vpmovzxbd_avx(auVar90);
              auVar98._8_8_ = 0;
              auVar98._0_8_ = *(ulong *)((long)puVar28 + 0x1c);
              auVar45 = vpmovzxbd_avx(auVar98);
              auVar94._16_16_ = auVar45;
              auVar94._0_16_ = auVar75;
              auVar48 = vcvtdq2ps_avx(auVar94);
              auVar84._0_4_ = fVar8 * auVar48._0_4_ + fVar7;
              auVar84._4_4_ = fVar8 * auVar48._4_4_ + fVar7;
              auVar84._8_4_ = fVar8 * auVar48._8_4_ + fVar7;
              auVar84._12_4_ = fVar8 * auVar48._12_4_ + fVar7;
              auVar84._16_4_ = fVar8 * auVar48._16_4_ + fVar7;
              auVar84._20_4_ = fVar8 * auVar48._20_4_ + fVar7;
              auVar84._24_4_ = fVar8 * auVar48._24_4_ + fVar7;
              auVar84._28_4_ = fVar8 + fVar7;
              fVar5 = *(float *)((long)puVar28 + 0x44);
              auVar91._8_8_ = 0;
              auVar91._0_8_ = puVar28[4];
              auVar75 = vpmovzxbd_avx(auVar91);
              auVar99._8_8_ = 0;
              auVar99._0_8_ = *(ulong *)((long)puVar28 + 0x24);
              auVar45 = vpmovzxbd_avx(auVar99);
              auVar95._16_16_ = auVar45;
              auVar95._0_16_ = auVar75;
              auVar100._8_8_ = 0;
              auVar100._0_8_ = puVar28[5];
              auVar75 = vpmovzxbd_avx(auVar100);
              auVar103._8_8_ = 0;
              auVar103._0_8_ = *(ulong *)((long)puVar28 + 0x2c);
              auVar45 = vpmovzxbd_avx(auVar103);
              auVar102._16_16_ = auVar45;
              auVar102._0_16_ = auVar75;
              auVar48 = vcvtdq2ps_avx(auVar95);
              auVar54 = vcvtdq2ps_avx(auVar102);
              fVar6 = *(float *)(puVar28 + 7);
              auVar96._0_4_ = fVar6 + fVar5 * auVar48._0_4_;
              auVar96._4_4_ = fVar6 + fVar5 * auVar48._4_4_;
              auVar96._8_4_ = fVar6 + fVar5 * auVar48._8_4_;
              auVar96._12_4_ = fVar6 + fVar5 * auVar48._12_4_;
              auVar96._16_4_ = fVar6 + fVar5 * auVar48._16_4_;
              auVar96._20_4_ = fVar6 + fVar5 * auVar48._20_4_;
              auVar96._24_4_ = fVar6 + fVar5 * auVar48._24_4_;
              auVar96._28_4_ = fVar6 + auVar48._28_4_;
              auVar88._0_4_ = fVar6 + fVar5 * auVar54._0_4_;
              auVar88._4_4_ = fVar6 + fVar5 * auVar54._4_4_;
              auVar88._8_4_ = fVar6 + fVar5 * auVar54._8_4_;
              auVar88._12_4_ = fVar6 + fVar5 * auVar54._12_4_;
              auVar88._16_4_ = fVar6 + fVar5 * auVar54._16_4_;
              auVar88._20_4_ = fVar6 + fVar5 * auVar54._20_4_;
              auVar88._24_4_ = fVar6 + fVar5 * auVar54._24_4_;
              auVar88._28_4_ = fVar6 + fVar5;
              auVar16._4_4_ = fStack_24dc;
              auVar16._0_4_ = local_24e0;
              auVar16._8_4_ = fStack_24d8;
              auVar16._12_4_ = fStack_24d4;
              auVar16._16_4_ = fStack_24d0;
              auVar16._20_4_ = fStack_24cc;
              auVar16._24_4_ = fStack_24c8;
              auVar16._28_4_ = fStack_24c4;
              auVar48 = vmaxps_avx(auVar16,auVar78);
              auVar54 = vminps_avx(auVar48,auVar84);
              auVar13._4_4_ = fStack_24fc;
              auVar13._0_4_ = local_2500;
              auVar13._8_4_ = fStack_24f8;
              auVar13._12_4_ = fStack_24f4;
              auVar13._16_4_ = fStack_24f0;
              auVar13._20_4_ = fStack_24ec;
              auVar13._24_4_ = fStack_24e8;
              auVar13._28_4_ = fStack_24e4;
              auVar48 = vmaxps_avx(auVar13,auVar96);
              auVar60 = vminps_avx(auVar48,auVar88);
              auVar19._4_4_ = fStack_24bc;
              auVar19._0_4_ = local_24c0;
              auVar19._8_4_ = fStack_24b8;
              auVar19._12_4_ = fStack_24b4;
              auVar19._16_4_ = fStack_24b0;
              auVar19._20_4_ = fStack_24ac;
              auVar19._24_4_ = fStack_24a8;
              auVar19._28_4_ = fStack_24a4;
              auVar48 = vmaxps_avx(auVar19,auVar62);
              auVar48 = vminps_avx(auVar48,auVar73);
              auVar48 = vsubps_avx(auVar48,auVar19);
              auVar54 = vsubps_avx(auVar54,auVar16);
              auVar60 = vsubps_avx(auVar60,auVar13);
              local_2520._0_4_ =
                   auVar48._0_4_ * auVar48._0_4_ + auVar54._0_4_ * auVar54._0_4_ +
                   auVar60._0_4_ * auVar60._0_4_;
              local_2520._4_4_ =
                   auVar48._4_4_ * auVar48._4_4_ + auVar54._4_4_ * auVar54._4_4_ +
                   auVar60._4_4_ * auVar60._4_4_;
              fStack_2518 = auVar48._8_4_ * auVar48._8_4_ + auVar54._8_4_ * auVar54._8_4_ +
                            auVar60._8_4_ * auVar60._8_4_;
              fStack_2514 = auVar48._12_4_ * auVar48._12_4_ + auVar54._12_4_ * auVar54._12_4_ +
                            auVar60._12_4_ * auVar60._12_4_;
              fStack_2510 = auVar48._16_4_ * auVar48._16_4_ + auVar54._16_4_ * auVar54._16_4_ +
                            auVar60._16_4_ * auVar60._16_4_;
              fStack_250c = auVar48._20_4_ * auVar48._20_4_ + auVar54._20_4_ * auVar54._20_4_ +
                            auVar60._20_4_ * auVar60._20_4_;
              fStack_2508 = auVar48._24_4_ * auVar48._24_4_ + auVar54._24_4_ * auVar54._24_4_ +
                            auVar60._24_4_ * auVar60._24_4_;
              fStack_2504 = auVar48._28_4_ + auVar54._28_4_ + auVar60._28_4_;
              auVar75 = vpminub_avx(auVar51,auVar67);
              auVar52._8_8_ = 0;
              auVar52._0_8_ = *puVar28;
              auVar75 = vpcmpeqb_avx(auVar52,auVar75);
              auVar45 = vpminub_avx(auVar42,auVar64);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)((long)puVar28 + 4);
              auVar45 = vpcmpeqb_avx(auVar43,auVar45);
              auVar48 = vcmpps_avx(auVar62,auVar73,2);
              auVar75 = vpmovsxbd_avx(auVar105 ^ auVar75);
              auVar45 = vpmovsxbd_avx(auVar105 ^ auVar45);
              auVar49._16_16_ = auVar45;
              auVar49._0_16_ = auVar75;
              auVar54 = vcvtdq2ps_avx(auVar49);
              auVar54 = vcmpps_avx(auVar107._0_32_,auVar54,1);
              auVar48 = vandps_avx(auVar48,auVar54);
              auVar23._4_4_ = fStack_23bc;
              auVar23._0_4_ = local_23c0;
              auVar23._8_4_ = fStack_23b8;
              auVar23._12_4_ = fStack_23b4;
              auVar23._16_4_ = fStack_23b0;
              auVar23._20_4_ = fStack_23ac;
              auVar23._24_4_ = fStack_23a8;
              auVar23._28_4_ = fStack_23a4;
              auVar54 = vcmpps_avx(_local_2520,auVar23,2);
LAB_015c16d4:
              auVar48 = vandps_avx(auVar48,auVar54);
              uVar41 = vmovmskps_avx(auVar48);
              unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),uVar41);
            }
          }
          else if ((uVar38 & 8) == 0) {
            puVar28 = (ulong *)((uVar38 & 0xfffffffffffffff0) + 0x40);
            if ((uVar38 & 0xfffffffffffffff0) == 0) {
              puVar28 = (ulong *)0x0;
            }
            auVar44._8_8_ = 0;
            auVar44._0_8_ = *puVar28;
            auVar75 = vpmovzxbd_avx(auVar44);
            auVar57._8_8_ = 0;
            auVar57._0_8_ = *(ulong *)((long)puVar28 + 4);
            auVar45 = vpmovzxbd_avx(auVar57);
            auVar55._16_16_ = auVar45;
            auVar55._0_16_ = auVar75;
            auVar65._8_8_ = 0;
            auVar65._0_8_ = puVar28[1];
            auVar75 = vpmovzxbd_avx(auVar65);
            auVar72._8_8_ = 0;
            auVar72._0_8_ = *(ulong *)((long)puVar28 + 0xc);
            auVar45 = vpmovzxbd_avx(auVar72);
            auVar69._16_16_ = auVar45;
            auVar69._0_16_ = auVar75;
            auVar75 = vpminub_avx(auVar44,auVar65);
            auVar45._8_8_ = 0;
            auVar45._0_8_ = *puVar28;
            auVar75 = vpcmpeqb_avx(auVar45,auVar75);
            auVar45 = vpminub_avx(auVar57,auVar72);
            fVar5 = *(float *)(puVar28 + 6);
            fVar6 = *(float *)((long)puVar28 + 0x3c);
            auVar58._8_8_ = 0;
            auVar58._0_8_ = *(ulong *)((long)puVar28 + 4);
            auVar45 = vpcmpeqb_avx(auVar58,auVar45);
            auVar48 = vcvtdq2ps_avx(auVar55);
            auVar56._0_4_ = fVar5 + fVar6 * auVar48._0_4_;
            auVar56._4_4_ = fVar5 + fVar6 * auVar48._4_4_;
            auVar56._8_4_ = fVar5 + fVar6 * auVar48._8_4_;
            auVar56._12_4_ = fVar5 + fVar6 * auVar48._12_4_;
            auVar56._16_4_ = fVar5 + fVar6 * auVar48._16_4_;
            auVar56._20_4_ = fVar5 + fVar6 * auVar48._20_4_;
            auVar56._24_4_ = fVar5 + fVar6 * auVar48._24_4_;
            auVar56._28_4_ = fVar5 + auVar48._28_4_;
            auVar48 = vcvtdq2ps_avx(auVar69);
            fVar7 = *(float *)((long)puVar28 + 0x34);
            auVar63._0_4_ = fVar5 + fVar6 * auVar48._0_4_;
            auVar63._4_4_ = fVar5 + fVar6 * auVar48._4_4_;
            auVar63._8_4_ = fVar5 + fVar6 * auVar48._8_4_;
            auVar63._12_4_ = fVar5 + fVar6 * auVar48._12_4_;
            auVar63._16_4_ = fVar5 + fVar6 * auVar48._16_4_;
            auVar63._20_4_ = fVar5 + fVar6 * auVar48._20_4_;
            auVar63._24_4_ = fVar5 + fVar6 * auVar48._24_4_;
            auVar63._28_4_ = fVar5 + auVar48._28_4_;
            fVar5 = *(float *)(puVar28 + 8);
            auVar68._8_8_ = 0;
            auVar68._0_8_ = puVar28[2];
            auVar44 = vpmovzxbd_avx(auVar68);
            auVar81._8_8_ = 0;
            auVar81._0_8_ = *(ulong *)((long)puVar28 + 0x14);
            auVar57 = vpmovzxbd_avx(auVar81);
            auVar70._16_16_ = auVar57;
            auVar70._0_16_ = auVar44;
            auVar48 = vcvtdq2ps_avx(auVar70);
            auVar71._0_4_ = fVar7 + fVar5 * auVar48._0_4_;
            auVar71._4_4_ = fVar7 + fVar5 * auVar48._4_4_;
            auVar71._8_4_ = fVar7 + fVar5 * auVar48._8_4_;
            auVar71._12_4_ = fVar7 + fVar5 * auVar48._12_4_;
            auVar71._16_4_ = fVar7 + fVar5 * auVar48._16_4_;
            auVar71._20_4_ = fVar7 + fVar5 * auVar48._20_4_;
            auVar71._24_4_ = fVar7 + fVar5 * auVar48._24_4_;
            auVar71._28_4_ = fVar7 + auVar48._28_4_;
            auVar82._8_8_ = 0;
            auVar82._0_8_ = puVar28[3];
            auVar44 = vpmovzxbd_avx(auVar82);
            auVar87._8_8_ = 0;
            auVar87._0_8_ = *(ulong *)((long)puVar28 + 0x1c);
            auVar57 = vpmovzxbd_avx(auVar87);
            auVar85._16_16_ = auVar57;
            auVar85._0_16_ = auVar44;
            auVar48 = vcvtdq2ps_avx(auVar85);
            fVar6 = *(float *)(puVar28 + 7);
            auVar74._0_4_ = fVar7 + fVar5 * auVar48._0_4_;
            auVar74._4_4_ = fVar7 + fVar5 * auVar48._4_4_;
            auVar74._8_4_ = fVar7 + fVar5 * auVar48._8_4_;
            auVar74._12_4_ = fVar7 + fVar5 * auVar48._12_4_;
            auVar74._16_4_ = fVar7 + fVar5 * auVar48._16_4_;
            auVar74._20_4_ = fVar7 + fVar5 * auVar48._20_4_;
            auVar74._24_4_ = fVar7 + fVar5 * auVar48._24_4_;
            auVar74._28_4_ = fVar7 + fVar5;
            fVar5 = *(float *)((long)puVar28 + 0x44);
            auVar76._8_8_ = 0;
            auVar76._0_8_ = puVar28[4];
            auVar44 = vpmovzxbd_avx(auVar76);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = *(ulong *)((long)puVar28 + 0x24);
            auVar57 = vpmovzxbd_avx(auVar92);
            auVar79._16_16_ = auVar57;
            auVar79._0_16_ = auVar44;
            auVar93._8_8_ = 0;
            auVar93._0_8_ = puVar28[5];
            auVar44 = vpmovzxbd_avx(auVar93);
            auVar101._8_8_ = 0;
            auVar101._0_8_ = *(ulong *)((long)puVar28 + 0x2c);
            auVar57 = vpmovzxbd_avx(auVar101);
            auVar97._16_16_ = auVar57;
            auVar97._0_16_ = auVar44;
            auVar48 = vcvtdq2ps_avx(auVar79);
            auVar80._0_4_ = fVar6 + fVar5 * auVar48._0_4_;
            auVar80._4_4_ = fVar6 + fVar5 * auVar48._4_4_;
            auVar80._8_4_ = fVar6 + fVar5 * auVar48._8_4_;
            auVar80._12_4_ = fVar6 + fVar5 * auVar48._12_4_;
            auVar80._16_4_ = fVar6 + fVar5 * auVar48._16_4_;
            auVar80._20_4_ = fVar6 + fVar5 * auVar48._20_4_;
            auVar80._24_4_ = fVar6 + fVar5 * auVar48._24_4_;
            auVar80._28_4_ = fVar6 + auVar48._28_4_;
            auVar48 = vcvtdq2ps_avx(auVar97);
            auVar86._0_4_ = fVar5 * auVar48._0_4_ + fVar6;
            auVar86._4_4_ = fVar5 * auVar48._4_4_ + fVar6;
            auVar86._8_4_ = fVar5 * auVar48._8_4_ + fVar6;
            auVar86._12_4_ = fVar5 * auVar48._12_4_ + fVar6;
            auVar86._16_4_ = fVar5 * auVar48._16_4_ + fVar6;
            auVar86._20_4_ = fVar5 * auVar48._20_4_ + fVar6;
            auVar86._24_4_ = fVar5 * auVar48._24_4_ + fVar6;
            auVar86._28_4_ = fVar5 + fVar6;
            auVar20._4_4_ = fStack_24bc;
            auVar20._0_4_ = local_24c0;
            auVar20._8_4_ = fStack_24b8;
            auVar20._12_4_ = fStack_24b4;
            auVar20._16_4_ = fStack_24b0;
            auVar20._20_4_ = fStack_24ac;
            auVar20._24_4_ = fStack_24a8;
            auVar20._28_4_ = fStack_24a4;
            auVar48 = vmaxps_avx(auVar20,auVar56);
            auVar48 = vminps_avx(auVar48,auVar63);
            auVar54 = vsubps_avx(auVar48,auVar20);
            auVar17._4_4_ = fStack_24dc;
            auVar17._0_4_ = local_24e0;
            auVar17._8_4_ = fStack_24d8;
            auVar17._12_4_ = fStack_24d4;
            auVar17._16_4_ = fStack_24d0;
            auVar17._20_4_ = fStack_24cc;
            auVar17._24_4_ = fStack_24c8;
            auVar17._28_4_ = fStack_24c4;
            auVar48 = vmaxps_avx(auVar17,auVar71);
            auVar48 = vminps_avx(auVar48,auVar74);
            auVar60 = vsubps_avx(auVar48,auVar17);
            auVar14._4_4_ = fStack_24fc;
            auVar14._0_4_ = local_2500;
            auVar14._8_4_ = fStack_24f8;
            auVar14._12_4_ = fStack_24f4;
            auVar14._16_4_ = fStack_24f0;
            auVar14._20_4_ = fStack_24ec;
            auVar14._24_4_ = fStack_24e8;
            auVar14._28_4_ = fStack_24e4;
            auVar48 = vmaxps_avx(auVar14,auVar80);
            auVar48 = vminps_avx(auVar48,auVar86);
            auVar48 = vsubps_avx(auVar48,auVar14);
            local_2520._4_4_ =
                 auVar54._4_4_ * auVar54._4_4_ + auVar60._4_4_ * auVar60._4_4_ +
                 auVar48._4_4_ * auVar48._4_4_;
            local_2520._0_4_ =
                 auVar54._0_4_ * auVar54._0_4_ + auVar60._0_4_ * auVar60._0_4_ +
                 auVar48._0_4_ * auVar48._0_4_;
            fStack_2518 = auVar54._8_4_ * auVar54._8_4_ + auVar60._8_4_ * auVar60._8_4_ +
                          auVar48._8_4_ * auVar48._8_4_;
            fStack_2514 = auVar54._12_4_ * auVar54._12_4_ + auVar60._12_4_ * auVar60._12_4_ +
                          auVar48._12_4_ * auVar48._12_4_;
            fStack_2510 = auVar54._16_4_ * auVar54._16_4_ + auVar60._16_4_ * auVar60._16_4_ +
                          auVar48._16_4_ * auVar48._16_4_;
            fStack_250c = auVar54._20_4_ * auVar54._20_4_ + auVar60._20_4_ * auVar60._20_4_ +
                          auVar48._20_4_ * auVar48._20_4_;
            fStack_2508 = auVar54._24_4_ * auVar54._24_4_ + auVar60._24_4_ * auVar60._24_4_ +
                          auVar48._24_4_ * auVar48._24_4_;
            fStack_2504 = auVar54._28_4_ + auVar60._28_4_ + auVar48._28_4_;
            auVar75 = vpmovsxbd_avx(auVar105 ^ auVar75);
            auVar45 = vpmovsxbd_avx(auVar105 ^ auVar45);
            auVar50._16_16_ = auVar45;
            auVar50._0_16_ = auVar75;
            auVar48 = vcmpps_avx(auVar56,auVar63,2);
            auVar22._4_4_ = fStack_23fc;
            auVar22._0_4_ = local_2400;
            auVar22._8_4_ = fStack_23f8;
            auVar22._12_4_ = fStack_23f4;
            auVar22._16_4_ = fStack_23f0;
            auVar22._20_4_ = fStack_23ec;
            auVar22._24_4_ = fStack_23e8;
            auVar22._28_4_ = fStack_23e4;
            auVar54 = vcmpps_avx(auVar56,auVar22,2);
            auVar48 = vandps_avx(auVar54,auVar48);
            auVar54 = vcvtdq2ps_avx(auVar50);
            auVar54 = vcmpps_avx(auVar107._0_32_,auVar54,1);
            auVar60 = vcmpps_avx(auVar63,local_23e0,5);
            auVar54 = vandps_avx(auVar60,auVar54);
            auVar48 = vandps_avx(auVar48,auVar54);
            auVar21._4_4_ = fStack_243c;
            auVar21._0_4_ = local_2440;
            auVar21._8_4_ = fStack_2438;
            auVar21._12_4_ = fStack_2434;
            auVar21._16_4_ = fStack_2430;
            auVar21._20_4_ = fStack_242c;
            auVar21._24_4_ = fStack_2428;
            auVar21._28_4_ = fStack_2424;
            auVar54 = vcmpps_avx(auVar71,auVar21,2);
            auVar60 = vcmpps_avx(auVar74,local_2420,5);
            auVar54 = vandps_avx(auVar54,auVar60);
            auVar60 = vcmpps_avx(auVar80,local_2480,2);
            auVar54 = vandps_avx(auVar54,auVar60);
            auVar48 = vandps_avx(auVar48,auVar54);
            auVar54 = vcmpps_avx(auVar86,local_2460,5);
            goto LAB_015c16d4;
          }
          pauVar35 = pauVar34;
          if ((uVar38 & 8) == 0) {
            if (unaff_R15 == 0) {
              iVar27 = 4;
            }
            else {
              uVar37 = uVar38 & 0xfffffffffffffff0;
              lVar29 = 0;
              if (unaff_R15 != 0) {
                for (; (unaff_R15 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                }
              }
              iVar27 = 0;
              uVar38 = *(ulong *)(uVar37 + lVar29 * 8);
              uVar33 = unaff_R15 - 1 & unaff_R15;
              if (uVar33 != 0) {
                uVar3 = *(uint *)(local_2520 + lVar29 * 4);
                lVar29 = 0;
                if (uVar33 != 0) {
                  for (; (uVar33 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                  }
                }
                uVar4 = *(ulong *)(uVar37 + lVar29 * 8);
                uVar2 = *(uint *)(local_2520 + lVar29 * 4);
                uVar33 = uVar33 - 1 & uVar33;
                if (uVar33 == 0) {
                  pauVar35 = pauVar34 + 1;
                  if (uVar3 < uVar2) {
                    *(ulong *)*pauVar34 = uVar4;
                    *(uint *)(*pauVar34 + 8) = uVar2;
                  }
                  else {
                    *(ulong *)*pauVar34 = uVar38;
                    *(uint *)(*pauVar34 + 8) = uVar3;
                    uVar38 = uVar4;
                  }
                }
                else {
                  auVar46._8_8_ = 0;
                  auVar46._0_8_ = uVar38;
                  auVar75 = vpunpcklqdq_avx(auVar46,ZEXT416(uVar3));
                  auVar53._8_8_ = 0;
                  auVar53._0_8_ = uVar4;
                  auVar45 = vpunpcklqdq_avx(auVar53,ZEXT416(uVar2));
                  lVar29 = 0;
                  if (uVar33 != 0) {
                    for (; (uVar33 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                    }
                  }
                  auVar59._8_8_ = 0;
                  auVar59._0_8_ = *(ulong *)(uVar37 + lVar29 * 8);
                  auVar44 = vpunpcklqdq_avx(auVar59,ZEXT416(*(uint *)(local_2520 + lVar29 * 4)));
                  uVar33 = uVar33 - 1 & uVar33;
                  if (uVar33 == 0) {
                    auVar105 = vpcmpgtd_avx(auVar45,auVar75);
                    auVar57 = vpshufd_avx(auVar105,0xaa);
                    auVar105 = vblendvps_avx(auVar45,auVar75,auVar57);
                    auVar75 = vblendvps_avx(auVar75,auVar45,auVar57);
                    auVar45 = vpcmpgtd_avx(auVar44,auVar105);
                    auVar57 = vpshufd_avx(auVar45,0xaa);
                    auVar45 = vblendvps_avx(auVar44,auVar105,auVar57);
                    auVar105 = vblendvps_avx(auVar105,auVar44,auVar57);
                    auVar44 = vpcmpgtd_avx(auVar105,auVar75);
                    auVar57 = vpshufd_avx(auVar44,0xaa);
                    auVar44 = vblendvps_avx(auVar105,auVar75,auVar57);
                    auVar105 = vblendvps_avx(auVar75,auVar105,auVar57);
                    *pauVar34 = auVar105;
                    pauVar34[1] = auVar44;
                    uVar38 = auVar45._0_8_;
                    pauVar35 = pauVar34 + 2;
                  }
                  else {
                    lVar29 = 0;
                    if (uVar33 != 0) {
                      for (; (uVar33 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                      }
                    }
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = *(ulong *)(uVar37 + lVar29 * 8);
                    auVar57 = vpunpcklqdq_avx(auVar66,ZEXT416(*(uint *)(local_2520 + lVar29 * 4)));
                    uVar33 = uVar33 - 1 & uVar33;
                    if (uVar33 == 0) {
                      auVar58 = vpcmpgtd_avx(auVar45,auVar75);
                      auVar65 = vpshufd_avx(auVar58,0xaa);
                      auVar58 = vblendvps_avx(auVar45,auVar75,auVar65);
                      auVar75 = vblendvps_avx(auVar75,auVar45,auVar65);
                      auVar45 = vpcmpgtd_avx(auVar57,auVar44);
                      auVar65 = vpshufd_avx(auVar45,0xaa);
                      auVar45 = vblendvps_avx(auVar57,auVar44,auVar65);
                      auVar44 = vblendvps_avx(auVar44,auVar57,auVar65);
                      auVar57 = vpcmpgtd_avx(auVar44,auVar75);
                      auVar65 = vpshufd_avx(auVar57,0xaa);
                      auVar57 = vblendvps_avx(auVar44,auVar75,auVar65);
                      auVar75 = vblendvps_avx(auVar75,auVar44,auVar65);
                      auVar44 = vpcmpgtd_avx(auVar45,auVar58);
                      auVar65 = vpshufd_avx(auVar44,0xaa);
                      auVar44 = vblendvps_avx(auVar45,auVar58,auVar65);
                      auVar45 = vblendvps_avx(auVar58,auVar45,auVar65);
                      auVar58 = vpcmpgtd_avx(auVar57,auVar45);
                      auVar65 = vpshufd_avx(auVar58,0xaa);
                      auVar58 = vblendvps_avx(auVar57,auVar45,auVar65);
                      auVar45 = vblendvps_avx(auVar45,auVar57,auVar65);
                      *pauVar34 = auVar75;
                      pauVar34[1] = auVar45;
                      pauVar34[2] = auVar58;
                      uVar38 = auVar44._0_8_;
                      pauVar35 = pauVar34 + 3;
                    }
                    else {
                      *pauVar34 = auVar75;
                      pauVar34[1] = auVar45;
                      pauVar34[2] = auVar44;
                      pauVar34[3] = auVar57;
                      lVar29 = 0x30;
                      do {
                        lVar39 = lVar29;
                        lVar29 = 0;
                        if (uVar33 != 0) {
                          for (; (uVar33 >> lVar29 & 1) == 0; lVar29 = lVar29 + 1) {
                          }
                        }
                        auVar47._8_8_ = 0;
                        auVar47._0_8_ = *(ulong *)(uVar37 + lVar29 * 8);
                        auVar75 = vpunpcklqdq_avx(auVar47,ZEXT416(*(uint *)(local_2520 + lVar29 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar34[1] + lVar39) = auVar75;
                        uVar33 = uVar33 & uVar33 - 1;
                        lVar29 = lVar39 + 0x10;
                      } while (uVar33 != 0);
                      pauVar35 = (undefined1 (*) [16])(pauVar34[1] + lVar39);
                      if (lVar39 + 0x10 != 0) {
                        lVar29 = 0x10;
                        pauVar31 = pauVar34;
                        do {
                          auVar75 = pauVar31[1];
                          uVar3 = *(uint *)(pauVar31[1] + 8);
                          pauVar31 = pauVar31 + 1;
                          lVar39 = lVar29;
                          do {
                            if (uVar3 <= *(uint *)(pauVar34[-1] + lVar39 + 8)) {
                              pauVar32 = (undefined1 (*) [16])(*pauVar34 + lVar39);
                              break;
                            }
                            *(undefined1 (*) [16])(*pauVar34 + lVar39) =
                                 *(undefined1 (*) [16])(pauVar34[-1] + lVar39);
                            lVar39 = lVar39 + -0x10;
                            pauVar32 = pauVar34;
                          } while (lVar39 != 0);
                          *pauVar32 = auVar75;
                          lVar29 = lVar29 + 0x10;
                        } while (pauVar35 != pauVar31);
                      }
                      uVar38 = *(ulong *)*pauVar35;
                    }
                    auVar105 = vpcmpeqd_avx(auVar105,auVar105);
                    auVar106 = ZEXT1664(auVar105);
                    iVar27 = 0;
                  }
                }
              }
            }
          }
          else {
            iVar27 = 6;
          }
          pauVar34 = pauVar35;
        } while (iVar27 == 0);
      } while ((iVar27 != 6) || (uVar37 = (ulong)((uint)uVar38 & 0xf), uVar37 == 8));
      lVar39 = (uVar38 & 0xfffffffffffffff0) + 0xa0;
      lVar29 = 0;
      bVar24 = 0;
      do {
        bVar30 = bVar24;
        lVar36 = -4;
        bVar40 = 0;
        do {
          uVar3 = *(uint *)(lVar39 + lVar36 * 4);
          if ((ulong)uVar3 == 0xffffffff) break;
          this = (context->scene->geometries).items[uVar3].ptr;
          context->geomID = uVar3;
          context->primID = *(uint *)(lVar39 + 0x10 + lVar36 * 4);
          auVar106 = ZEXT1664(auVar106._0_16_);
          bVar25 = Geometry::pointQuery(this,query,context);
          bVar40 = bVar40 | bVar25;
          lVar36 = lVar36 + 1;
        } while (lVar36 != 0);
        lVar29 = lVar29 + 1;
        lVar39 = lVar39 + 0xb0;
        bVar24 = bVar30 | bVar40;
      } while (lVar29 != uVar37 - 8);
      auVar104 = ZEXT1664(local_2490);
      auVar105 = vpcmpeqd_avx(auVar106._0_16_,auVar106._0_16_);
      auVar106 = ZEXT1664(auVar105);
      auVar107 = ZEXT3264(CONCAT428(0xbf800000,
                                    CONCAT424(0xbf800000,
                                              CONCAT420(0xbf800000,
                                                        CONCAT416(0xbf800000,
                                                                  CONCAT412(0xbf800000,
                                                                            CONCAT48(0xbf800000,
                                                                                                                                                                          
                                                  0xbf800000bf800000)))))));
    } while (bVar30 == 0 && bVar40 == 0);
    uVar41 = *(undefined4 *)&(context->query_radius).field_0;
    auVar48._4_4_ = uVar41;
    auVar48._0_4_ = uVar41;
    auVar48._8_4_ = uVar41;
    auVar48._12_4_ = uVar41;
    auVar48._16_4_ = uVar41;
    auVar48._20_4_ = uVar41;
    auVar48._24_4_ = uVar41;
    auVar48._28_4_ = uVar41;
    uVar41 = *(undefined4 *)((long)&(context->query_radius).field_0 + 4);
    auVar60._4_4_ = uVar41;
    auVar60._0_4_ = uVar41;
    auVar60._8_4_ = uVar41;
    auVar60._12_4_ = uVar41;
    auVar60._16_4_ = uVar41;
    auVar60._20_4_ = uVar41;
    auVar60._24_4_ = uVar41;
    auVar60._28_4_ = uVar41;
    uVar41 = *(undefined4 *)((long)&(context->query_radius).field_0 + 8);
    auVar54._4_4_ = uVar41;
    auVar54._0_4_ = uVar41;
    auVar54._8_4_ = uVar41;
    auVar54._12_4_ = uVar41;
    auVar54._16_4_ = uVar41;
    auVar54._20_4_ = uVar41;
    auVar54._24_4_ = uVar41;
    auVar54._28_4_ = uVar41;
    if (context->query_type == POINT_QUERY_TYPE_SPHERE) {
      auVar104 = ZEXT464((uint)(query->radius * query->radius));
    }
    else {
      aVar1 = (context->query_radius).field_0;
      auVar105 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
      auVar104 = ZEXT1664(auVar105);
    }
    bVar26 = true;
  } while( true );
}

Assistant:

static __forceinline bool pointQuery(const Accel::Intersectors* This, PointQuery* query, PointQueryContext* context)
      {
        const BVH* __restrict__ bvh = (const BVH*)This->ptr;
        
        /* we may traverse an empty BVH in case all geometry was invalid */
        if (bvh->root == BVH::emptyNode)
          return false;
        
        /* stack state */
        StackItemT<NodeRef> stack[stackSize];    // stack of nodes
        StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
        StackItemT<NodeRef>* stackEnd = stack+stackSize;
        stack[0].ptr  = bvh->root;
        stack[0].dist = neg_inf;
        
        /* verify correct input */
        assert(!(types & BVH_MB) || (query->time >= 0.0f && query->time <= 1.0f));

        /* load the point query into SIMD registers */
        TravPointQuery<N> tquery(query->p, context->query_radius);

        /* initialize the node traverser */
        BVHNNodeTraverser1Hit<N,types> nodeTraverser;

        bool changed = false;
        float cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                          ? query->radius * query->radius
                          : dot(context->query_radius, context->query_radius);

        /* pop loop */
        while (true) pop:
        {
          /* pop next node */
          if (unlikely(stackPtr == stack)) break;
          stackPtr--;
          NodeRef cur = NodeRef(stackPtr->ptr);

          /* if popped node is too far, pop next one */
          if (unlikely(*(float*)&stackPtr->dist > cull_radius))
            continue;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(point_query.trav_nodes,1,1,1);
            bool nodeIntersected;
            if (likely(context->query_type == POINT_QUERY_TYPE_SPHERE)) {
              nodeIntersected = BVHNNodePointQuerySphere1<N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            } else {
              nodeIntersected = BVHNNodePointQueryAABB1  <N, types>::pointQuery(cur, tquery, query->time, tNear, mask);
            }
            if (unlikely(!nodeIntersected)) { STAT3(point_query.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(point_query.trav_leaves,1,1,1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
          size_t lazy_node = 0;
          if (PrimitiveIntersector1::pointQuery(This, query, context, prim, num, tquery, lazy_node))
          {
            changed = true;
            tquery.rad = context->query_radius;
            cull_radius = context->query_type == POINT_QUERY_TYPE_SPHERE
                        ? query->radius * query->radius
                        : dot(context->query_radius, context->query_radius);
          }

          /* push lazy node onto stack */
          if (unlikely(lazy_node)) {
            stackPtr->ptr = lazy_node;
            stackPtr->dist = neg_inf;
            stackPtr++;
          }
        }
        return changed;
      }